

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void dlmalloc_stats(void)

{
  mchunkptr pmVar1;
  malloc_segment *pmVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  mchunkptr pmVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    iVar4 = 1;
    LOCK();
    UNLOCK();
    bVar11 = _gm_.mutex != 0;
    _gm_.mutex = iVar4;
    if (bVar11) {
      uVar6 = 1;
      while (_gm_.mutex != 0) {
        if ((uVar6 & 0x3f) == 0) {
          sched_yield();
        }
        uVar6 = uVar6 + 1;
      }
      LOCK();
      UNLOCK();
      _gm_.mutex = iVar4;
    }
  }
  if (_gm_.top == (mchunkptr)0x0) {
    lVar5 = 0;
    sVar3 = 0;
    sVar10 = 0;
  }
  else {
    lVar5 = (_gm_.footprint - _gm_.topsize) + -0x50;
    pmVar2 = &_gm_.seg;
    do {
      pmVar1 = (mchunkptr)pmVar2->base;
      uVar6 = (int)pmVar1 + 0x10;
      uVar7 = (ulong)(-uVar6 & 0xf);
      if ((uVar6 & 0xf) == 0) {
        uVar7 = 0;
      }
      pmVar8 = (mchunkptr)((long)&pmVar1->prev_foot + uVar7);
      do {
        if (((pmVar8 == _gm_.top) ||
            ((mchunkptr)((long)&pmVar1->prev_foot + pmVar2->size) <= pmVar8)) ||
           (uVar7 = pmVar8->head, uVar7 == 0xb)) break;
        uVar9 = 0;
        if (((uint)uVar7 & 3) == 1) {
          uVar9 = uVar7 & 0xfffffffffffffff8;
        }
        lVar5 = lVar5 - uVar9;
        pmVar8 = (mchunkptr)((long)&pmVar8->prev_foot + (uVar7 & 0xfffffffffffffff8));
      } while (pmVar1 <= pmVar8);
      pmVar2 = pmVar2->next;
      sVar3 = _gm_.max_footprint;
      sVar10 = _gm_.footprint;
    } while (pmVar2 != (malloc_segment *)0x0);
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  fprintf((FILE *)stderr,"max system bytes = %10lu\n",sVar3);
  fprintf((FILE *)stderr,"system bytes     = %10lu\n",sVar10);
  fprintf((FILE *)stderr,"in use bytes     = %10lu\n",lVar5);
  return;
}

Assistant:

static void internal_malloc_stats(mstate m) {
  ensure_initialization();
  if (!PREACTION(m)) {
    size_t maxfp = 0;
    size_t fp = 0;
    size_t used = 0;
    check_malloc_state(m);
    if (is_initialized(m)) {
      msegmentptr s = &m->seg;
      maxfp = m->max_footprint;
      fp = m->footprint;
      used = fp - (m->topsize + TOP_FOOT_SIZE);

      while (s != 0) {
        mchunkptr q = align_as_chunk(s->base);
        while (segment_holds(s, q) &&
               q != m->top && q->head != FENCEPOST_HEAD) {
          if (!is_inuse(q))
            used -= chunksize(q);
          q = next_chunk(q);
        }
        s = s->next;
      }
    }
    POSTACTION(m); /* drop lock */
    fprintf(stderr, "max system bytes = %10lu\n", (unsigned long)(maxfp));
    fprintf(stderr, "system bytes     = %10lu\n", (unsigned long)(fp));
    fprintf(stderr, "in use bytes     = %10lu\n", (unsigned long)(used));
  }
}